

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::udp_tracker_connection::udp_tracker_connection
          (udp_tracker_connection *this,io_context *ios,tracker_manager *man,tracker_request *req,
          weak_ptr<libtorrent::aux::request_callback> *c)

{
  _Atomic_word *p_Var1;
  int iVar2;
  weak_ptr<libtorrent::aux::request_callback> local_148;
  tracker_request local_130;
  
  tracker_request::tracker_request(&local_130,req);
  local_148.super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (c->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_148.super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (c->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  (c->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (c->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tracker_connection::tracker_connection
            (&this->super_tracker_connection,man,&local_130,ios,&local_148);
  if (local_148.super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_148.
                 super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_148.
               super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_148.super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_148.super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_130.outgoing_socket.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_130.outgoing_socket.m_sock.
                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_130.outgoing_socket.m_sock.
               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_130.outgoing_socket.m_sock.
       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_130.outgoing_socket.m_sock.
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_130.ipv4.
      super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.ipv4.
                    super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.ipv4.
                          super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.ipv4.
                          super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.ipv6.
      super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.ipv6.
                    super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.ipv6.
                          super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.ipv6.
                          super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.filter.
               super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.trackerid._M_dataplus._M_p != &local_130.trackerid.field_2) {
    operator_delete(local_130.trackerid._M_dataplus._M_p,
                    local_130.trackerid.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.url._M_dataplus._M_p != &local_130.url.field_2) {
    operator_delete(local_130.url._M_dataplus._M_p,local_130.url.field_2._M_allocated_capacity + 1);
  }
  (this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler =
       (_func_int **)&PTR_on_timeout_004e7cb0;
  (this->m_hostname)._M_dataplus._M_p = (pointer)&(this->m_hostname).field_2;
  (this->m_hostname)._M_string_length = 0;
  (this->m_hostname).field_2._M_local_buf[0] = '\0';
  (this->m_endpoints).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_endpoints).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_endpoints).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)((long)&(this->m_target).impl_.data_ + 8) = 0;
  *(undefined8 *)((long)&(this->m_target).impl_.data_ + 0x10) = 0;
  (this->m_target).impl_.data_.v6.sin6_scope_id = 0;
  *(undefined8 *)&(this->m_target).impl_.data_ = 2;
  this->m_transaction_id = 0;
  this->m_attempts = 0;
  this->m_state = error;
  this->m_abort = false;
  update_transaction_id(this);
  return;
}

Assistant:

udp_tracker_connection::udp_tracker_connection(
		io_context& ios
		, tracker_manager& man
		, tracker_request const& req
		, std::weak_ptr<request_callback> c)
		: tracker_connection(man, req, ios, std::move(c))
		, m_transaction_id(0)
		, m_attempts(0)
		, m_state(action_t::error)
		, m_abort(false)
	{
		update_transaction_id();
	}